

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_volume_status_tec(REF_GRID ref_grid,char *filename)

{
  REF_INT node0;
  REF_NODE ref_node;
  bool bVar1;
  uint uVar2;
  int iVar3;
  REF_DBL *scalar;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  double dVar8;
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  char *vars [2];
  REF_EDGE local_68;
  REF_GRID local_60;
  char *local_58;
  double local_50;
  char *local_48;
  char *local_40;
  
  ref_node = ref_grid->node;
  local_48 = "s";
  local_40 = "l";
  uVar2 = ref_node->max;
  if ((int)uVar2 < 0) {
    uVar2 = 1;
    pcVar6 = "malloc scalar of REF_DBL negative";
  }
  else {
    scalar = (REF_DBL *)malloc((ulong)uVar2 << 4);
    if (scalar != (REF_DBL *)0x0) {
      bVar1 = true;
      if ((ulong)uVar2 != 0) {
        uVar2 = uVar2 * 2;
        uVar4 = 0;
        do {
          scalar[uVar4] = 1.0;
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      goto LAB_00167a50;
    }
    uVar2 = 2;
    pcVar6 = "malloc scalar of REF_DBL NULL";
  }
  bVar1 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x119f,
         "ref_gather_volume_status_tec",pcVar6);
  scalar = (REF_DBL *)0x0;
LAB_00167a50:
  if (bVar1) {
    uVar2 = ref_edge_create(&local_68,ref_grid);
    if (uVar2 == 0) {
      local_60 = ref_grid;
      local_58 = filename;
      if (0 < local_68->n) {
        lVar7 = 0;
        do {
          node0 = local_68->e2n[lVar7 * 2];
          iVar3 = local_68->e2n[lVar7 * 2 + 1];
          uVar2 = ref_node_ratio(ref_node,node0,iVar3,&local_50);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x11a4,"ref_gather_volume_status_tec",(ulong)uVar2,"ratio");
            return uVar2;
          }
          dVar8 = scalar[(long)node0 * 2];
          if (local_50 <= scalar[(long)node0 * 2]) {
            dVar8 = local_50;
          }
          scalar[(long)node0 * 2] = dVar8;
          dVar8 = scalar[(long)iVar3 * 2];
          if (local_50 <= scalar[(long)iVar3 * 2]) {
            dVar8 = local_50;
          }
          scalar[(long)iVar3 * 2] = dVar8;
          iVar5 = node0 * 2 + 1;
          dVar8 = scalar[iVar5];
          if (scalar[iVar5] <= local_50) {
            dVar8 = local_50;
          }
          scalar[iVar5] = dVar8;
          iVar3 = iVar3 * 2 + 1;
          dVar8 = scalar[iVar3];
          if (scalar[iVar3] <= local_50) {
            dVar8 = local_50;
          }
          scalar[iVar3] = dVar8;
          lVar7 = lVar7 + 1;
        } while (lVar7 < local_68->n);
      }
      uVar2 = ref_edge_free(local_68);
      if (uVar2 == 0) {
        uVar2 = ref_gather_scalar_by_extension(local_60,2,scalar,&local_48,local_58);
        if (uVar2 == 0) {
          uVar2 = 0;
          if (scalar != (REF_DBL *)0x0) {
            free(scalar);
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x11ad,"ref_gather_volume_status_tec",(ulong)uVar2,"dump");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x11aa,"ref_gather_volume_status_tec",(ulong)uVar2,"free edges");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x11a0,"ref_gather_volume_status_tec",(ulong)uVar2,"create edges");
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_gather_volume_status_tec(REF_GRID ref_grid,
                                                const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT edge, node0, node1;
  REF_EDGE ref_edge;
  REF_DBL *scalar, edge_ratio;
  const char *vars[2];
  REF_INT ldim = 2;

  vars[0] = "s";
  vars[1] = "l";
  ref_malloc_init(scalar, ldim * ref_node_max(ref_node), REF_DBL, 1.0);
  RSS(ref_edge_create(&ref_edge, ref_grid), "create edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    scalar[0 + ldim * node0] = MIN(scalar[0 + ldim * node0], edge_ratio);
    scalar[0 + ldim * node1] = MIN(scalar[0 + ldim * node1], edge_ratio);
    scalar[1 + ldim * node0] = MAX(scalar[1 + ldim * node0], edge_ratio);
    scalar[1 + ldim * node1] = MAX(scalar[1 + ldim * node1], edge_ratio);
  }
  RSS(ref_edge_free(ref_edge), "free edges");

  RSS(ref_gather_scalar_by_extension(ref_grid, ldim, scalar, vars, filename),
      "dump");

  ref_free(scalar);

  return REF_SUCCESS;
}